

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aatree.c
# Opt level: O1

Aatree * dodelete(DelInfo *info,Aatree *T,void **ret_value)

{
  int iVar1;
  Aatree *pAVar2;
  void *pvVar3;
  int iVar4;
  Aatree *L;
  Aatree *pAVar5;
  Aatree *R_1;
  Aatree *pAVar6;
  Aatree *pAVar7;
  Aatree *R;
  long lVar8;
  
  pAVar5 = &nil;
  if (T != &nil) {
    info->last = T;
    iVar4 = (*info->compare)(info->key,T->key);
    if (iVar4 < 0) {
      lVar8 = 8;
    }
    else {
      info->deleted = T;
      lVar8 = 0x10;
    }
    pAVar5 = dodelete(info,*(Aatree **)((long)&T->level + lVar8),ret_value);
    *(Aatree **)((long)&T->level + lVar8) = pAVar5;
    if (((info->last == T) && (info->deleted != &nil)) &&
       (iVar4 = (*info->compare)(info->key,info->deleted->key), iVar4 == 0)) {
      pAVar5 = T->right;
      *ret_value = info->deleted->value;
      pAVar7 = info->deleted;
      pvVar3 = T->value;
      pAVar7->key = T->key;
      pAVar7->value = pvVar3;
      info->deleted = &nil;
      al_free_with_context
                (T,0x8b,
                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/misc/aatree.c"
                 ,"dodelete");
    }
    else {
      pAVar7 = T->left;
      iVar1 = T->level;
      iVar4 = iVar1 + -1;
      if ((pAVar7->level < iVar4) || (pAVar5 = T, T->right->level < iVar4)) {
        T->level = iVar4;
        if (iVar1 <= T->right->level) {
          T->right->level = iVar4;
        }
        if (pAVar7->level == T->level) {
          T->left = pAVar7->right;
          pAVar7->right = T;
          T = pAVar7;
        }
        pAVar5 = T->right;
        pAVar7 = &nil;
        if ((pAVar5 != &nil) &&
           (pAVar6 = pAVar5->left, pAVar7 = pAVar5, pAVar6->level == pAVar5->level)) {
          pAVar5->left = pAVar6->right;
          pAVar6->right = pAVar5;
          pAVar7 = pAVar6;
        }
        T->right = pAVar7;
        pAVar5 = pAVar7->right;
        pAVar7 = &nil;
        if ((pAVar5 != &nil) &&
           (pAVar6 = pAVar5->left, pAVar7 = pAVar5, pAVar6->level == pAVar5->level)) {
          pAVar5->left = pAVar6->right;
          pAVar6->right = pAVar5;
          pAVar7 = pAVar6;
        }
        T->right->right = pAVar7;
        pAVar5 = &nil;
        if ((T != &nil) && (pAVar7 = T->right, pAVar5 = T, T->level == pAVar7->right->level)) {
          T->right = pAVar7->left;
          pAVar7->left = T;
          pAVar7->level = pAVar7->level + 1;
          pAVar5 = pAVar7;
        }
        pAVar7 = pAVar5->right;
        pAVar6 = &nil;
        if ((pAVar7 != &nil) &&
           (pAVar2 = pAVar7->right, pAVar6 = pAVar7, pAVar7->level == pAVar2->right->level)) {
          pAVar7->right = pAVar2->left;
          pAVar2->left = pAVar7;
          pAVar2->level = pAVar2->level + 1;
          pAVar6 = pAVar2;
        }
        pAVar5->right = pAVar6;
      }
    }
  }
  return pAVar5;
}

Assistant:

static Aatree *dodelete(struct DelInfo *info, Aatree *T, void **ret_value)
{
   if (T == &nil)
      return T;

   /* Search down the tree and set pointers last and deleted. */
   info->last = T;
   if (info->compare(info->key, T->key) < 0) {
      T->left = dodelete(info, T->left, ret_value);
   }
   else {
      info->deleted = T;
      T->right = dodelete(info, T->right, ret_value);
   }

   /* At the bottom of the tree we remove the element if it is present. */
   if (T == info->last &&
      info->deleted != &nil &&
      info->compare(info->key, info->deleted->key) == 0)
   {
      Aatree *right = T->right;
      *ret_value = info->deleted->value;
      info->deleted->key = T->key;
      info->deleted->value = T->value;
      info->deleted = &nil;
      al_free(T);
      return right;
   }

   /* On the way back, we rebalance. */
   if (T->left->level < T->level - 1
      || T->right->level < T->level - 1)
   {
      T->level--;
      if (T->right->level > T->level) {
         T->right->level = T->level;
      }
      T = skew(T);
      T->right = skew(T->right);
      T->right->right = skew(T->right->right);
      T = split(T);
      T->right = split(T->right);
   }
   return T;
}